

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O1

string * __thiscall
gmlc::networking::TcpAcceptor::to_string_abi_cxx11_
          (string *__return_storage_ptr__,TcpAcceptor *this)

{
  ushort uVar1;
  uint __val;
  uint __len;
  string __str;
  undefined1 local_40 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_30;
  
  if ((this->endpoint_).impl_.data_.base.sa_family == 2) {
    local_40._0_8_ = (ulong)(this->endpoint_).impl_.data_.v6.sin6_flowinfo << 0x20;
    local_40._8_8_ = 0;
    aStack_30._M_allocated_capacity = 0;
    aStack_30._8_4_ = 0;
  }
  else {
    local_40._8_8_ = *(size_type *)((long)&(this->endpoint_).impl_.data_ + 8);
    aStack_30._M_allocated_capacity = *(size_type *)((long)&(this->endpoint_).impl_.data_ + 0x10);
    aStack_30._8_4_ = (this->endpoint_).impl_.data_.v6.sin6_scope_id;
    local_40._0_8_ = (pointer)0x1;
  }
  ::asio::ip::address::to_string_abi_cxx11_(__return_storage_ptr__,(address *)local_40);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,':');
  uVar1 = (this->endpoint_).impl_.data_.v4.sin_port;
  uVar1 = uVar1 << 8 | uVar1 >> 8;
  __val = (uint)uVar1;
  __len = 1;
  if (((9 < uVar1) && (__len = 2, 99 < uVar1)) && (__len = 3, 999 < __val)) {
    __len = 5 - (__val < 10000);
  }
  local_40._0_8_ = &aStack_30;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (ulong)__len,'-');
  CLI::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_40._0_8_,__len,__val);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,(char *)local_40._0_8_,local_40._8_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._0_8_ != &aStack_30) {
    operator_delete((void *)local_40._0_8_,aStack_30._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TcpAcceptor::to_string() const
{
    auto str = endpoint_.address().to_string();
    str += ':';
    str += std::to_string(endpoint_.port());
    return str;
}